

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O1

void replay_hash(ResourceTag tag,Hash hash,DatabaseInterface *db_iface,StateReplayer *replayer,
                StateCreatorInterface *iface,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json)

{
  pointer buffer;
  char *__s;
  _func_int **pp_Var1;
  _func_int *p_Var2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  DatabaseInterface *pDVar7;
  size_t state_json_size;
  size_type local_38;
  
  puVar6 = (undefined8 *)(ulong)tag;
  puVar5 = puVar6;
  pDVar7 = db_iface;
  iVar4 = (*db_iface->_vptr_DatabaseInterface[3])(db_iface,puVar6,hash,&local_38,0,0);
  if ((char)iVar4 == '\0') {
    replay_hash();
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(state_json,local_38);
    pDVar7 = db_iface;
    iVar4 = (*db_iface->_vptr_DatabaseInterface[3])
                      (db_iface,puVar6,hash,&local_38,
                       (state_json->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start,0);
    puVar5 = puVar6;
    if ((char)iVar4 != '\0') {
      buffer = (state_json->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar3 = Fossilize::StateReplayer::parse
                        (replayer,iface,db_iface,buffer,
                         (long)(state_json->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)buffer);
      if (!bVar3) {
        replay_hash();
      }
      return;
    }
  }
  replay_hash();
  __s = (char *)*puVar5;
  pp_Var1 = pDVar7->_vptr_DatabaseInterface;
  p_Var2 = pp_Var1[1];
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pp_Var1,0,(char *)p_Var2,(ulong)__s);
  return;
}

Assistant:

static void replay_hash(ResourceTag tag, Hash hash, DatabaseInterface &db_iface,
                        StateReplayer &replayer, StateCreatorInterface &iface,
                        vector<uint8_t> &state_json)
{
	size_t state_json_size;
	if (!db_iface.read_entry(tag, hash, &state_json_size, nullptr, 0))
	{
		LOGE("Failed to load blob from cache.\n");
		exit(EXIT_FAILURE);
	}

	state_json.resize(state_json_size);

	if (!db_iface.read_entry(tag, hash, &state_json_size, state_json.data(), 0))
	{
		LOGE("Failed to load blob from cache.\n");
		exit(EXIT_FAILURE);
	}

	if (!replayer.parse(iface, &db_iface, state_json.data(), state_json.size()))
		LOGE("Failed to parse blob (tag: %d, hash: 0x%016" PRIx64 ").\n", tag, hash);
}